

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O2

void __thiscall Refal2::CQualifierBuilder::AddL(CQualifierBuilder *this)

{
  _Base_bitset<2UL> local_30;
  _Base_bitset<2UL> local_20;
  
  if (this->negative == true) {
    local_30._M_w = (_WordT  [2])std::bitset<128UL>::operator~((bitset<128UL> *)AnsiL);
    local_20._M_w = (_WordT  [2])std::operator|((bitset<128UL> *)&local_30,&this->ansicharsFixed);
    std::_Base_bitset<2UL>::_M_do_and(&(this->ansichars).super__Base_bitset<2UL>,&local_20);
  }
  else {
    local_30._M_w = (_WordT  [2])std::bitset<128UL>::operator~(&this->ansicharsFixed);
    local_20._M_w = (_WordT  [2])std::operator&((bitset<128UL> *)AnsiL,(bitset<128UL> *)&local_30);
    std::_Base_bitset<2UL>::_M_do_or(&(this->ansichars).super__Base_bitset<2UL>,&local_20);
  }
  std::_Base_bitset<2UL>::_M_do_or
            (&(this->ansicharsFixed).super__Base_bitset<2UL>,(_Base_bitset<2UL> *)AnsiL);
  return;
}

Assistant:

void CQualifierBuilder::AddL()
{
	if( negative ) {
		ansichars &= ~AnsiL | ansicharsFixed;
	} else {
		ansichars |= AnsiL & ~ansicharsFixed;
	}
	ansicharsFixed |= AnsiL;
}